

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffrdef(fitsfile *fptr,int *status)

{
  int iVar1;
  char local_138 [8];
  char valstring [71];
  char local_e8 [8];
  char comm [73];
  char card [81];
  long local_38;
  LONGLONG pcount;
  LONGLONG naxis2;
  int tstatus;
  int dummy;
  int *status_local;
  fitsfile *fptr_local;
  
  naxis2._0_4_ = 0;
  if (*status < 1) {
    _tstatus = status;
    status_local = &fptr->HDUposition;
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if (fptr->Fptr->writemode == 1) {
        if (fptr->Fptr->datastart != -1) {
          if (fptr->Fptr->hdutype != 0) {
            ffmaky(fptr,2,status);
            iVar1 = ffgkyjj((fitsfile *)status_local,"NAXIS2",&pcount,local_e8,(int *)&naxis2);
            if (0 < iVar1) {
              pcount = *(LONGLONG *)(*(long *)(status_local + 2) + 0x3c0);
            }
            if ((pcount < *(long *)(*(long *)(status_local + 2) + 0x3c0)) &&
               (*(long *)(*(long *)(status_local + 2) + 0x3b8) == pcount)) {
              snprintf(local_138,0x47,"%.0f",(double)*(long *)(*(long *)(status_local + 2) + 0x3c0))
              ;
              ffmkky("NAXIS2",local_138,local_e8,comm + 0x48,_tstatus);
              ffmkey((fitsfile *)status_local,comm + 0x48,_tstatus);
            }
          }
          if (0 < *(long *)(*(long *)(status_local + 2) + 0x3e0)) {
            ffmaky((fitsfile *)status_local,2,_tstatus);
            ffgkyjj((fitsfile *)status_local,"PCOUNT",&local_38,local_e8,_tstatus);
            if (*(long *)(*(long *)(status_local + 2) + 0x3e0) != local_38) {
              ffmkyj((fitsfile *)status_local,"PCOUNT",
                     *(LONGLONG *)(*(long *)(status_local + 2) + 0x3e0),local_e8,_tstatus);
            }
          }
        }
        iVar1 = ffwend((fitsfile *)status_local,_tstatus);
        if (iVar1 < 1) {
          ffrhdu((fitsfile *)status_local,(int *)((long)&naxis2 + 4),_tstatus);
        }
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    fptr_local._4_4_ = *_tstatus;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffrdef(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  ReDEFine the structure of a data unit.  This routine re-reads
  the CHDU header keywords to determine the structure and length of the
  current data unit.  This redefines the start of the next HDU.
*/
{
    int dummy, tstatus = 0;
    LONGLONG naxis2;
    LONGLONG pcount;
    char card[FLEN_CARD], comm[FLEN_COMMENT], valstring[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    else if ((fptr->Fptr)->writemode == 1) /* write access to the file? */
    {
        /* don't need to check NAXIS2 and PCOUNT if data hasn't been written */
        if ((fptr->Fptr)->datastart != DATA_UNDEFINED)
        {
          /* update NAXIS2 keyword if more rows were written to the table */
          /* and if the user has not explicitly reset the NAXIS2 value */
          if ((fptr->Fptr)->hdutype != IMAGE_HDU)
          {
            ffmaky(fptr, 2, status);
            if (ffgkyjj(fptr, "NAXIS2", &naxis2, comm, &tstatus) > 0)
            {
                /* Couldn't read NAXIS2 (odd!);  in certain circumstances */
                /* this may be normal, so ignore the error. */
                naxis2 = (fptr->Fptr)->numrows;
            }

            if ((fptr->Fptr)->numrows > naxis2
              && (fptr->Fptr)->origrows == naxis2)
              /* if origrows is not equal to naxis2, then the user must */
              /* have manually modified the NAXIS2 keyword value, and */
              /* we will assume that the current value is correct. */
            {
              /* would be simpler to just call ffmkyj here, but this */
              /* would force linking in all the modkey & putkey routines */

              /* print as double because the 64-bit int conversion */
              /* is platform dependent (%lld, %ld, %I64 )          */

              snprintf(valstring,FLEN_VALUE, "%.0f", (double) ((fptr->Fptr)->numrows));

              ffmkky("NAXIS2", valstring, comm, card, status);
              ffmkey(fptr, card, status);
            }
          }

          /* if data has been written to variable length columns in a  */
          /* binary table, then we may need to update the PCOUNT value */
          if ((fptr->Fptr)->heapsize > 0)
          {
            ffmaky(fptr, 2, status);
            ffgkyjj(fptr, "PCOUNT", &pcount, comm, status);
            if ((fptr->Fptr)->heapsize != pcount)
            {
              ffmkyj(fptr, "PCOUNT", (fptr->Fptr)->heapsize, comm, status);
            }
          }
        }

        if (ffwend(fptr, status) <= 0)     /* rewrite END keyword and fill */
        {
            ffrhdu(fptr, &dummy, status);  /* re-scan the header keywords  */
        }
    }
    return(*status);
}